

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::detail::
int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>::
on_num(int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned___int128>
       *this)

{
  char cVar1;
  buffer<char> *pbVar2;
  basic_format_specs<char> *specs;
  size_t sVar3;
  size_t __n;
  char cVar4;
  int iVar5;
  ulong uVar6;
  char *__dest;
  char *pcVar7;
  _Alloc_hider _Var8;
  int iVar9;
  ulong uVar10;
  int num_digits;
  int iVar11;
  ptrdiff_t _Num;
  ulong __n_00;
  ulong uVar12;
  ulong uVar13;
  string_view prefix;
  undefined1 auVar14 [16];
  buffer<char> *c;
  string groups;
  write_int_data<char> data;
  undefined7 in_stack_ffffffffffffff18;
  string local_b8;
  write_int_data<char> local_98;
  char *local_88;
  ulong local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  ulong local_68;
  ulong local_60;
  int local_58;
  string *local_50;
  char local_48;
  
  grouping_impl<char>(&local_b8,(locale_ref)(this->locale).locale_);
  if (local_b8._M_string_length == 0) {
    on_dec(this);
    goto LAB_0010b4eb;
  }
  cVar4 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
  if (cVar4 == '\0') {
    on_dec(this);
    goto LAB_0010b4eb;
  }
  uVar12 = (ulong)this->abs_value;
  uVar10 = *(ulong *)((long)&this->abs_value + 8);
  auVar14 = (undefined1  [16])this->abs_value;
  iVar11 = 1;
  if ((uVar12 < 10) <= uVar10) {
    iVar9 = 4;
    do {
      iVar11 = iVar9;
      uVar13 = auVar14._8_8_;
      uVar6 = auVar14._0_8_;
      if (uVar13 == 0 && (ulong)(99 < uVar6) <= -uVar13) {
        iVar11 = iVar11 + -2;
        goto LAB_0010b331;
      }
      if (uVar13 == 0 && (ulong)(999 < uVar6) <= -uVar13) {
        iVar11 = iVar11 + -1;
        goto LAB_0010b331;
      }
      if (uVar13 < (uVar6 < 10000)) goto LAB_0010b331;
      auVar14 = __udivti3(uVar6,uVar13,10000,0);
      iVar9 = iVar11 + 4;
    } while (uVar13 != 0 || -uVar13 < (ulong)(99999 < uVar6));
    iVar11 = iVar11 + 1;
  }
LAB_0010b331:
  pcVar7 = local_b8._M_dataplus._M_p + local_b8._M_string_length;
  _Var8._M_p = local_b8._M_dataplus._M_p;
  iVar9 = iVar11;
  if (local_b8._M_string_length == 0) {
LAB_0010b373:
    num_digits = iVar9;
    iVar5 = iVar11;
    if (_Var8._M_p == pcVar7) goto LAB_0010b37d;
  }
  else {
    num_digits = (int)local_b8._M_string_length + iVar11;
    do {
      cVar1 = *_Var8._M_p;
      iVar5 = iVar11 - cVar1;
      if ((iVar5 == 0 || iVar11 < cVar1) || ((byte)(cVar1 + 0x81U) < 0x82)) goto LAB_0010b373;
      iVar9 = iVar9 + 1;
      _Var8._M_p = _Var8._M_p + 1;
      local_b8._M_string_length = local_b8._M_string_length - 1;
      iVar11 = iVar5;
    } while (local_b8._M_string_length != 0);
LAB_0010b37d:
    num_digits = (iVar5 + -1) / (int)pcVar7[-1] + num_digits;
  }
  pbVar2 = (this->out).container;
  specs = this->specs;
  pcVar7 = this->prefix;
  __n_00 = (ulong)this->prefix_size;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = pcVar7;
  prefix.size_._4_4_ = 0;
  write_int_data<char>::write_int_data(&local_98,num_digits,prefix,specs);
  uVar13 = CONCAT44(local_98.size._4_4_,(undefined4)local_98.size);
  local_78 = (undefined4)local_98.size;
  uStack_74 = local_98.size._4_4_;
  uStack_70 = (undefined4)local_98.padding;
  uStack_6c = local_98.padding._4_4_;
  uVar6 = (ulong)specs->width;
  local_88 = pcVar7;
  local_80 = __n_00;
  local_68 = uVar12;
  local_60 = uVar10;
  local_58 = num_digits;
  local_50 = &local_b8;
  local_48 = cVar4;
  if ((long)uVar6 < 0) {
    assert_fail((char *)this,0,(char *)CONCAT17(cVar4,in_stack_ffffffffffffff18));
  }
  uVar12 = 0;
  if (uVar13 <= uVar6) {
    uVar12 = uVar6 - uVar13;
  }
  uVar10 = uVar12 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                               (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
  sVar3 = pbVar2->size_;
  uVar13 = uVar13 + sVar3 + (specs->fill).size_ * uVar12;
  if (pbVar2->capacity_ < uVar13) {
    (**pbVar2->_vptr_buffer)(pbVar2,uVar13);
  }
  pbVar2->size_ = uVar13;
  __dest = fill<char*,char>(pbVar2->ptr_ + sVar3,uVar10,&specs->fill);
  if (__n_00 != 0) {
    memmove(__dest,pcVar7,__n_00);
    __dest = __dest + __n_00;
  }
  __n = CONCAT44(uStack_6c,uStack_70);
  pcVar7 = __dest;
  if (__n != 0) {
    pcVar7 = __dest + __n;
    memset(__dest,0x30,__n);
  }
  pcVar7 = int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>>,char,unsigned__int128>
           ::num_writer::operator()((num_writer *)&local_68,pcVar7);
  fill<char*,char>(pcVar7,uVar12 - uVar10,&specs->fill);
  (this->out).container = pbVar2;
LAB_0010b4eb:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && num_digits > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      num_digits -= *group;
      ++group;
    }
    if (group == groups.cend())
      size += sep_size * ((num_digits - 1) / groups.back());
    out = write_int(out, size, get_prefix(), specs,
                    num_writer{abs_value, size, groups, sep});
  }